

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::InlinedStringField::Release_abi_cxx11_
          (InlinedStringField *this,Arena *arena,bool donated)

{
  size_type *psVar1;
  undefined8 uVar2;
  string *psVar3;
  size_type *psVar4;
  
  psVar3 = (string *)operator_new(0x20);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar1 = (size_type *)(this->field_0).str_._M_dataplus._M_p;
  if (arena == (Arena *)0x0 || !donated) {
    psVar4 = (size_type *)((long)&this->field_0 + 0x10);
    if (psVar1 == psVar4) {
      uVar2 = *(undefined8 *)((long)&this->field_0 + 0x18);
      (psVar3->field_2)._M_allocated_capacity = *psVar4;
      *(undefined8 *)((long)&psVar3->field_2 + 8) = uVar2;
    }
    else {
      (psVar3->_M_dataplus)._M_p = (pointer)psVar1;
      (psVar3->field_2)._M_allocated_capacity = *psVar4;
    }
    psVar3->_M_string_length = (this->field_0).str_._M_string_length;
    *(size_type **)&this->field_0 = psVar4;
    (this->field_0).str_._M_string_length = 0;
    *(undefined1 *)((long)&this->field_0 + 0x10) = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar3,psVar1,
               (undefined1 *)((long)psVar1 + (this->field_0).str_._M_string_length));
    psVar4 = *(size_type **)&this->field_0;
  }
  (this->field_0).str_._M_string_length = 0;
  *(undefined1 *)psVar4 = 0;
  return psVar3;
}

Assistant:

std::string* InlinedStringField::Release(Arena* arena, bool donated) {
  // We can not steal donated arena strings.
  std::string* released = (arena != nullptr && donated)
                              ? new std::string(*get_mutable())
                              : new std::string(std::move(*get_mutable()));
  get_mutable()->clear();
  return released;
}